

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_equivalents4_Test::TestBody(stringToUnits_equivalents4_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_300;
  Message local_2f8;
  allocator local_2e9;
  string local_2e8;
  precise_unit local_2c8;
  unit local_2b4;
  allocator local_2a9;
  string local_2a8;
  precise_unit local_288;
  unit local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  allocator local_249;
  string local_248;
  precise_unit local_228;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  Message local_1c8;
  allocator local_1b9;
  string local_1b8;
  precise_unit local_198;
  allocator local_181;
  string local_180;
  precise_unit local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  allocator local_129;
  string local_128;
  precise_unit local_108;
  allocator local_f1;
  string local_f0;
  precise_unit local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  allocator local_99;
  string local_98;
  precise_unit local_78 [2];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_equivalents4_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"[CAR_AU]",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"[car_Au]",&local_99);
  uVar2 = units::getDefaultFlags();
  local_78[0] = units::unit_from_string(&local_98,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"unit_from_string(\"[CAR_AU]\")","unit_from_string(\"[car_Au]\")",
             &local_30,local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"[bu_us]",&local_f1);
  uVar2 = units::getDefaultFlags();
  local_d0 = units::unit_from_string(&local_f0,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"bushel - US",&local_129);
  uVar2 = units::getDefaultFlags();
  local_108 = units::unit_from_string(&local_128,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c0,"unit_from_string(\"[bu_us]\")",
             "unit_from_string(\"bushel - US\")",&local_d0,&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"[drp]",&local_181);
  uVar2 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_180,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"drop - metric (1/20 mL)",&local_1b9);
  uVar2 = units::getDefaultFlags();
  local_198 = units::unit_from_string(&local_1b8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_150,"unit_from_string(\"[drp]\")",
             "unit_from_string(\"drop - metric (1/20 mL)\")",&local_160,&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"[in_i\'Hg]",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"inch of mercury column",&local_249);
  uVar2 = units::getDefaultFlags();
  local_228 = units::unit_from_string(&local_248,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1e0,"unit_from_string(\"[in_i\'Hg]\")",
             "unit_from_string(\"inch of mercury column\")",&local_1f0,&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"nmol/mg{prot}",&local_2a9);
  uVar2 = units::getDefaultFlags();
  local_288 = units::unit_from_string(&local_2a8,uVar2);
  local_278 = units::unit_cast(&local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2e8,"nanomole of (1/2) cystine per milligram of protein",&local_2e9);
  uVar2 = units::getDefaultFlags();
  local_2c8 = units::unit_from_string(&local_2e8,uVar2);
  local_2b4 = units::unit_cast(&local_2c8);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_270,"unit_cast(unit_from_string(\"nmol/mg{prot}\"))",
             "unit_cast(unit_from_string( \"nanomole of (1/2) cystine per milligram of protein\"))",
             &local_278,&local_2b4);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3bc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  return;
}

Assistant:

TEST(stringToUnits, equivalents4)
{
    EXPECT_EQ(unit_from_string("[CAR_AU]"), unit_from_string("[car_Au]"));
    EXPECT_EQ(unit_from_string("[bu_us]"), unit_from_string("bushel - US"));
    EXPECT_EQ(
        unit_from_string("[drp]"), unit_from_string("drop - metric (1/20 mL)"));
    EXPECT_EQ(
        unit_from_string("[in_i'Hg]"),
        unit_from_string("inch of mercury column"));

    EXPECT_EQ(
        unit_cast(unit_from_string("nmol/mg{prot}")),
        unit_cast(unit_from_string(
            "nanomole of (1/2) cystine per milligram of protein")));
}